

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O2

void __thiscall
density::
conc_heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_ostream,_density::f_istream,_density::f_rtti>,_density::basic_default_allocator<65536UL>_>
::put_transaction<void>::put_transaction
          (put_transaction<void> *this,PrivateType param_1,unique_lock<std::mutex> *i_lock,
          put_transaction<void> *i_put_transaction)

{
  void *pvVar1;
  
  (this->m_lock)._M_device = i_lock->_M_device;
  (this->m_lock)._M_owns = i_lock->_M_owns;
  i_lock->_M_device = (mutex_type *)0x0;
  i_lock->_M_owns = false;
  (this->m_put_transaction).m_queue = i_put_transaction->m_queue;
  pvVar1 = (i_put_transaction->m_put_data).m_user_storage;
  (this->m_put_transaction).m_put_data.m_control_block =
       (i_put_transaction->m_put_data).m_control_block;
  (this->m_put_transaction).m_put_data.m_user_storage = pvVar1;
  i_put_transaction->m_queue =
       (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_ostream,_density::f_istream,_density::f_rtti>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  if ((this->m_put_transaction).m_queue ==
      (heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_ostream,_density::f_istream,_density::f_rtti>,_density::basic_default_allocator<65536UL>_>
       *)0x0) {
    std::unique_lock<std::mutex>::unlock(&this->m_lock);
  }
  return;
}

Assistant:

put_transaction(
              PrivateType,
              std::unique_lock<std::mutex> && i_lock,
              typename InnerQueue::template put_transaction<ELEMENT_COMPLETE_TYPE> &&
                i_put_transaction) noexcept
                : m_lock(std::move(i_lock)), m_put_transaction(std::move(i_put_transaction))
            {
                if (!m_put_transaction)
                    m_lock.unlock();
            }